

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall
soul::heart::Parser::parseReadStream
          (Parser *this,FunctionParseState *state,FunctionBuilder *builder,AssignmentTarget *target)

{
  Module *pMVar1;
  IODeclaration *this_00;
  Expression *dest;
  InputDeclaration *src_00;
  Identifier *args;
  string_view sVar2;
  pool_ptr<soul::heart::InputDeclaration> src;
  Identifier name;
  undefined1 local_90 [32];
  undefined1 local_70 [8];
  undefined1 local_68 [56];
  
  local_70 = (undefined1  [8])parseGeneralIdentifier(this);
  pMVar1 = pool_ptr<soul::Module>::operator->(&this->module);
  sVar2 = Identifier::operator_cast_to_basic_string_view((Identifier *)local_70);
  sVar2._M_str = (char *)sVar2._M_len;
  sVar2._M_len = (size_t)pMVar1;
  Module::findInput((Module *)local_90,sVar2);
  if ((ProgramImpl *)local_90._0_8_ == (ProgramImpl *)0x0) {
    Errors::cannotFindInput<soul::Identifier&>((CompileMessage *)local_68,(Errors *)local_70,args);
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,local_68);
    CompileMessage::~CompileMessage((CompileMessage *)local_68);
  }
  local_90._8_8_ =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.sourceCode.object;
  if ((ProgramImpl *)local_90._8_8_ != (ProgramImpl *)0x0) {
    (((ProgramImpl *)local_90._8_8_)->super_RefCountedObject).refCount =
         (((ProgramImpl *)local_90._8_8_)->super_RefCountedObject).refCount + 1;
  }
  local_90._16_8_ =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  this_00 = &pool_ptr<soul::heart::InputDeclaration>::operator->
                       ((pool_ptr<soul::heart::InputDeclaration> *)local_90)->super_IODeclaration;
  IODeclaration::getSingleDataType((Type *)local_68,this_00);
  AssignmentTarget::create
            ((AssignmentTarget *)(local_90 + 0x18),(FunctionParseState *)target,
             (FunctionBuilder *)state,(Type *)builder);
  dest = pool_ptr<soul::heart::Expression>::operator*
                   ((pool_ptr<soul::heart::Expression> *)(local_90 + 0x18));
  src_00 = pool_ptr<soul::heart::InputDeclaration>::operator*
                     ((pool_ptr<soul::heart::InputDeclaration> *)local_90);
  BlockBuilder::addReadStream
            (&builder->super_BlockBuilder,(CodeLocation *)(local_90 + 8),dest,src_00);
  RefCountedPtr<soul::Structure>::~RefCountedPtr
            ((RefCountedPtr<soul::Structure> *)(local_68 + 0x10));
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)(local_90 + 8));
  expectSemicolon(this);
  return;
}

Assistant:

void parseReadStream (FunctionParseState& state, FunctionBuilder& builder, const AssignmentTarget& target)
    {
        auto name = parseGeneralIdentifier();
        auto src = module->findInput (name);

        if (src == nullptr)
            throwError (Errors::cannotFindInput (name));

        builder.addReadStream (location, *target.create (state, builder, src->getSingleDataType()), *src);
        expectSemicolon();
    }